

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjust-times.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  raw_ostream *in_R9;
  string file;
  stat sb;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  InputFilenames;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Filename;
  opt<bool,_false,_llvm::cl::parser<bool>_> Verbose;
  opt<bool,_false,_llvm::cl::parser<bool>_> MTimeA;
  opt<int,_false,_llvm::cl::parser<int>_> Adjust;
  char buf_final [64];
  alias FilenameA;
  opt<bool,_false,_llvm::cl::parser<bool>_> MTimeM;
  alias VerboseA;
  alias AdjustA;
  opt<bool,_false,_llvm::cl::parser<bool>_> NowM;
  opt<bool,_false,_llvm::cl::parser<bool>_> NowP;
  char *local_928 [2];
  char local_918 [16];
  undefined4 local_908;
  undefined4 uStack_904;
  undefined4 uStack_900;
  undefined4 uStack_8fc;
  stat local_8f8;
  desc local_860 [9];
  long *local_7c8;
  long *local_7c0;
  desc local_790 [9];
  char *local_6f8;
  long local_6f0;
  char *local_6a0;
  undefined8 local_698;
  char local_608;
  int local_5e8 [38];
  char local_550;
  Option local_530;
  int local_498;
  FormattingFlags local_478 [16];
  alias local_438;
  opt<bool,false,llvm::cl::parser<bool>> local_398 [152];
  byte local_300;
  alias local_2e0;
  alias local_240;
  opt<bool,false,llvm::cl::parser<bool>> local_1a0 [152];
  char local_108;
  opt<bool,false,llvm::cl::parser<bool>> local_e8 [152];
  char local_50;
  
  local_860[0].Desc.Data = (char *)local_5e8;
  local_5e8[0] = 0;
  local_790[0].Desc.Data = "Move access and modification times";
  local_790[0].Desc.Length = 0x22;
  llvm::cl::opt<int,false,llvm::cl::parser<int>>::
  opt<char[7],llvm::cl::initializer<int>,llvm::cl::desc>
            ((opt<int,false,llvm::cl::parser<int>> *)&local_530,(char (*) [7])"adjust",
             (initializer<int> *)local_860,local_790);
  local_790[0].Desc.Data = (char *)&local_530;
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            (&local_240,(char (*) [2])0x16b6bb,(aliasopt *)local_790);
  local_790[0].Desc.Data = "Move the a/mtime a smallest amount backwards";
  local_790[0].Desc.Length = 0x2c;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)local_5e8,(char (*) [14])"mtime-add-ulp",
             local_790);
  local_790[0].Desc.Data = "Move the a/mtime a smallest amount Forwards";
  local_790[0].Desc.Length = 0x2b;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[16],llvm::cl::desc>
            (local_398,(char (*) [16])"mtime-minus-ulp",local_790);
  local_790[0].Desc.Data = "Set to current time plus epsilon";
  local_790[0].Desc.Length = 0x20;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[13],llvm::cl::desc>
            (local_e8,(char (*) [13])"now-plus-ulp",local_790);
  local_790[0].Desc.Data = "Set to current time minus epsilon";
  local_790[0].Desc.Length = 0x21;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
            (local_1a0,(char (*) [14])"now-minus-ulp",local_790);
  local_438.super_Option._vptr_Option = (_func_int **)0x15ddd3;
  local_860[0].Desc.Data = "Set access and modification times from FILE";
  local_860[0].Desc.Length = 0x2b;
  local_6a0 = "file";
  local_698 = 4;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[10],llvm::cl::initializer<char[1]>,llvm::cl::desc,llvm::cl::value_desc>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)local_790,
             (char (*) [10])"from-file",(initializer<char[1]> *)&local_438,local_860,
             (value_desc *)&local_6a0);
  local_860[0].Desc.Data = (char *)local_790;
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            (&local_438,(char (*) [2])0x15f614,(aliasopt *)local_860);
  local_860[0].Desc.Data = "Show what is being done";
  local_860[0].Desc.Length = 0x17;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[8],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&local_6a0,(char (*) [8])"verbose",local_860)
  ;
  local_860[0].Desc.Data = (char *)&local_6a0;
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            (&local_2e0,(char (*) [2])0x16bdd7,(aliasopt *)local_860);
  local_478[0] = Positional;
  local_8f8.st_dev = 0x15c1f5;
  local_8f8.st_ino = 0xd;
  local_928[0] = (char *)CONCAT44(local_928[0]._4_4_,3);
  llvm::cl::list<std::__cxx11::string,bool,llvm::cl::parser<std::__cxx11::string>>::
  list<llvm::cl::FormattingFlags,llvm::cl::desc,llvm::cl::NumOccurrencesFlag>
            ((list<std::__cxx11::string,bool,llvm::cl::parser<std::__cxx11::string>> *)local_860,
             local_478,(desc *)&local_8f8,(NumOccurrencesFlag *)local_928);
  llvm::cl::ParseCommandLineOptions
            ((cl *)(ulong)(uint)argc,(int)argv,(char **)"Modify timestamps of existing files\n",
             (StringRef)ZEXT816(0x24),in_R9);
  uVar5 = 4;
  if (local_550 == '\0') {
    uVar5 = (uint)local_300 + (uint)local_300 * 2;
  }
  uVar6 = 6;
  if (local_50 == '\0') {
    uVar6 = uVar5;
  }
  uVar5 = 5;
  if (local_108 == '\0') {
    uVar5 = uVar6;
  }
  if (local_498 == 0) {
LAB_0010e0db:
    if (local_6f0 == 0) {
      local_908 = 0;
      uStack_904 = 0;
      uStack_900 = 0x3fffffff;
      uStack_8fc = 0;
    }
    else {
      iVar1 = stat(local_6f8,&local_8f8);
      if (iVar1 == -1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"--from-file ");
        poVar3 = std::operator<<(poVar3,(string *)&local_6f8);
        poVar3 = std::operator<<(poVar3,": ");
        piVar2 = __errno_location();
        pcVar4 = strerror(*piVar2);
        goto LAB_0010e68a;
      }
      local_908 = (undefined4)local_8f8.st_mtim.tv_sec;
      uStack_904 = local_8f8.st_mtim.tv_sec._4_4_;
      uStack_900 = (undefined4)local_8f8.st_mtim.tv_nsec;
      uStack_8fc = local_8f8.st_mtim.tv_nsec._4_4_;
      uVar5 = 1;
    }
    if (local_7c8 != local_7c0) {
      local_928[0] = local_918;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_928,*local_7c8,local_7c8[1] + *local_7c8);
      if (local_608 != '\x01') {
        iVar1 = (*(code *)(&DAT_0015c020 + *(int *)(&DAT_0015c020 + (ulong)uVar5 * 4)))();
        return iVar1;
      }
      iVar1 = stat(local_928[0],&local_8f8);
      if (iVar1 != -1) {
        iVar1 = (*(code *)(&DAT_0015c020 + *(int *)(&DAT_0015c020 + (ulong)uVar5 * 4)))();
        return iVar1;
      }
      main_cold_12();
      main_cold_2();
      main_cold_3();
      main_cold_11();
      main_cold_1();
      main_cold_4();
    }
    llvm::cl::PrintHelpMessage(false,false);
    exit(0x40);
  }
  uVar5 = local_498 - 0xf4241;
  piVar2 = __errno_location();
  if (uVar5 < 0xffe17b7f) {
    *piVar2 = 0x22;
  }
  else if (*piVar2 == 0) {
    uVar5 = 2;
    goto LAB_0010e0db;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"--adjust ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_498);
  poVar3 = std::operator<<(poVar3,": ");
  pcVar4 = strerror(*piVar2);
LAB_0010e68a:
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(0x41);
}

Assistant:

int main(int argc, char **argv) {
  using namespace llvm;

  cl::opt<int>         Adjust   ("adjust", cl::init(0), cl::desc("Move access and modification times"));
  cl::alias            AdjustA  ("a", cl::aliasopt(Adjust));
  cl::opt<bool>        MTimeA   ("mtime-add-ulp", cl::desc("Move the a/mtime a smallest amount backwards"));
  cl::opt<bool>        MTimeM   ("mtime-minus-ulp", cl::desc("Move the a/mtime a smallest amount Forwards"));
  cl::opt<bool>        NowP     ("now-plus-ulp", cl::desc("Set to current time plus epsilon"));
  cl::opt<bool>        NowM     ("now-minus-ulp", cl::desc("Set to current time minus epsilon"));
  cl::opt<std::string> Filename ("from-file", cl::init(""), cl::desc("Set access and modification times from FILE"), cl::value_desc("file"));
  cl::alias            FilenameA("f", cl::aliasopt(Filename));
  cl::opt<bool>        Verbose  ("verbose", cl::desc("Show what is being done"));
  cl::alias            VerboseA ("v", cl::aliasopt(Verbose));
  cl::list<std::string> InputFilenames(cl::Positional, cl::desc("<Input files>"), cl::OneOrMore);

  cl::ParseCommandLineOptions(argc, argv, "Modify timestamps of existing files\n");

  enum mode {
    ModeSetToNow,
    ModeSetToFile,      // -f, --from-file
    ModeAdjustMtime,    // -a, --adjust
    ModeMtimeMinusULP,  // --mtime-minus-ulp
    ModeMtimePlusULP,   // --mtime-plus-ulp
    ModeNowMinusULP,    // --now-minus-ulp
    ModeNowPlusULP,     // --now-plus-ulp
  } mode = ModeSetToNow;

  struct timespec time_to_set = { 0, UTIME_NOW };
  double adjust_relative_sec = 0;

  if (MTimeM) {
    mode = ModeMtimeMinusULP;
  }
  if (MTimeA) {
    mode = ModeMtimePlusULP;
  }
  if (NowP) {
    mode = ModeNowPlusULP;
  }
  if (NowM) {
    mode = ModeNowMinusULP;
  }
  if (Adjust) {
    double value = Adjust;
    if (value < -1000000 || value > 1000000) {
      errno = ERANGE;
    }
    if (errno != 0) {
      std::cerr << "--adjust " << Adjust << ": " << strerror(errno) << std::endl;
      exit(EX_DATAERR);
    }
    adjust_relative_sec = value;
    mode = ModeAdjustMtime;
  }
  if (!Filename.empty()) {
    if (get_file_mtime(Filename.c_str(), &time_to_set) == -1) {
      std::cerr << "--from-file " << Filename << ": " << strerror(errno) << std::endl;
      exit(EX_DATAERR);
    }
    mode = ModeSetToFile;
  }

  // A list of filenames is required.
  if (InputFilenames.empty()) {
    cl::PrintHelpMessage();
    exit(EX_USAGE);
  }

  // Modify all files' access and modification times.
  for (std::string file : InputFilenames) {
    const char* filename = file.c_str();

    struct timespec previous_timestamp = { 0, UTIME_OMIT };
    if (Verbose) {
      if (get_file_mtime(filename, &previous_timestamp) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
    }

    switch (mode) {
    case ModeSetToNow:
    case ModeSetToFile:   // -f, --from
      if (file_time_set_fixed(filename, time_to_set) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeAdjustMtime:  // -a, --adjust
      if (file_time_adjust_relative(filename, adjust_relative_sec) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeMtimePlusULP:
    case ModeMtimeMinusULP:
      if (file_time_adjust_epsilon(filename, mode == ModeMtimeMinusULP ? -1 : 1) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeNowPlusULP:
    case ModeNowMinusULP:
      struct timespec now = { 0, UTIME_NOW };
      if (file_time_set_fixed(filename, now) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      if (file_time_adjust_epsilon(filename, mode == ModeNowMinusULP ? -1 : 1) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    }

    if (Verbose) {
      struct timespec final_timestamp;
      if (get_file_mtime(filename, &final_timestamp) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }

      fprintf(stderr, "%s: ", filename);
      switch (mode) {
      case ModeSetToNow:
      case ModeSetToFile:
        fprintf(stderr, "reset");
        break;
      case ModeAdjustMtime:
        fprintf(stderr, "adjusted %+.9gs", adjust_relative_sec);
        break;
      case ModeMtimeMinusULP:
        fprintf(stderr, "adjusted backward");
        break;
      case ModeMtimePlusULP:
        fprintf(stderr, "adjusted forward");
        break;
      case ModeNowMinusULP:
        fprintf(stderr, "set to now - epsilon");
        break;
      case ModeNowPlusULP:
        fprintf(stderr, "set to now + epsilon");
        break;
      }

      char buf_prev[64];
      char buf_final[64];
      time_format(buf_prev, sizeof(buf_prev), previous_timestamp);
      time_format(buf_final, sizeof(buf_final), final_timestamp);

      fprintf(stderr, "\n  from %s\n  to   %s\n", buf_prev, buf_final);
    }
  }

  return 0;
}